

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O2

void __thiscall five_point_solver::advance_b(five_point_solver *this)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  field3d<cellb> *pfVar22;
  field3d<celle> *pfVar23;
  celle ***pppcVar24;
  celle **ppcVar25;
  celle *pcVar26;
  celle *pcVar27;
  celle *pcVar28;
  celle *pcVar29;
  celle *pcVar30;
  celle *pcVar31;
  celle *pcVar32;
  cellb *pcVar33;
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  int i_1;
  long lVar41;
  int i_2;
  long lVar42;
  int i;
  long lVar43;
  int j;
  long lVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  
  pfVar22 = (this->super_maxwell_solver).cb;
  auVar52._8_8_ = 0x3fe0000000000000;
  auVar52._0_8_ = 0x3fe0000000000000;
  auVar53 = ZEXT816(0x3fe0000000000000);
  iVar21 = pfVar22->nz;
  lVar37 = (long)pfVar22->nx;
  lVar39 = (long)pfVar22->ny;
  lVar38 = lVar37 + -2;
  lVar40 = lVar39 + -2;
  lVar1 = (long)iVar21 + -2;
  for (lVar43 = 1; lVar43 < lVar38; lVar43 = lVar43 + 1) {
    for (lVar44 = 1; lVar44 < lVar40; lVar44 = lVar44 + 1) {
      lVar42 = 0x28;
      lVar41 = 1;
      dVar2 = (this->super_maxwell_solver).dtdy;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = dVar2;
      dVar3 = (this->super_maxwell_solver).dtdz;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = dVar3;
      dVar4 = (this->super_maxwell_solver).dtdx;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = dVar4;
      auVar9._0_8_ = this->bx;
      auVar9._8_8_ = this->by;
      dVar35 = this->ax;
      dVar36 = this->ay;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = this->by;
      dVar5 = this->ay;
      pfVar23 = (this->super_maxwell_solver).ce;
      auVar58._0_8_ = -dVar2;
      auVar58._8_8_ = 0x8000000000000000;
      auVar63._0_8_ = -dVar3;
      auVar63._8_8_ = 0x8000000000000000;
      auVar55 = vunpcklpd_avx(auVar67,auVar58);
      auVar34 = vunpcklpd_avx(auVar63,auVar60);
      auVar64._8_8_ = this->bz;
      auVar64._0_8_ = this->bz;
      dVar2 = this->az;
      while (lVar41 < lVar1) {
        pppcVar24 = (pfVar23->p)._M_t.
                    super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                    super__Head_base<0UL,_celle_***,_false>._M_head_impl;
        lVar41 = lVar41 + 1;
        ppcVar25 = pppcVar24[lVar43];
        pcVar26 = pppcVar24[lVar43 + 1][lVar44];
        pcVar27 = pppcVar24[lVar43 + 2][lVar44];
        pcVar28 = ppcVar25[lVar44];
        pcVar29 = ppcVar25[lVar44 + 1];
        pcVar30 = ppcVar25[lVar44 + -1];
        pcVar31 = ppcVar25[lVar44 + 2];
        pcVar32 = pppcVar24[lVar43 + -1][lVar44];
        pcVar33 = (pfVar22->p)._M_t.
                  super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                  super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar43][lVar44];
        auVar78._8_8_ = 0;
        auVar78._0_8_ = *(ulong *)((long)&pcVar26->ex + lVar42);
        dVar3 = *(double *)((long)&pcVar28->ex + lVar42);
        auVar88._8_8_ = dVar3;
        auVar88._0_8_ = dVar3;
        auVar45 = vmovhpd_avx(auVar78,*(undefined8 *)((long)&pcVar29->ex + lVar42));
        uVar6 = *(undefined8 *)((long)&pcVar31->ex + lVar42);
        auVar124._8_8_ = uVar6;
        auVar124._0_8_ = uVar6;
        auVar49 = vsubpd_avx(auVar45,auVar88);
        auVar45 = vsubpd_avx512vl(auVar124,auVar45);
        auVar79._0_8_ = dVar3 + auVar45._0_8_;
        auVar79._8_8_ = dVar3 + auVar45._8_8_;
        auVar89._8_8_ = 0;
        auVar89._0_8_ = *(ulong *)((long)&pcVar32->ex + lVar42);
        auVar45 = vmovhpd_avx(auVar89,*(undefined8 *)((long)&pcVar30->ex + lVar42));
        auVar47 = vsubpd_avx(auVar79,auVar45);
        auVar45 = *(undefined1 (*) [16])((long)&pcVar28->ey + lVar42);
        auVar80._0_8_ = auVar47._0_8_ * dVar35;
        auVar80._8_8_ = auVar47._8_8_ * dVar36;
        auVar47 = vfmadd231pd_fma(auVar80,auVar9,auVar49);
        auVar49 = *(undefined1 (*) [16])((long)pcVar28 + lVar42 + -0x10);
        auVar46 = vsubpd_avx512vl(auVar45,auVar49);
        auVar45 = vsubpd_avx512vl(*(undefined1 (*) [16])((long)&pcVar28[1].ey + lVar42),auVar45);
        auVar90._0_8_ = auVar49._0_8_ + auVar45._0_8_;
        auVar90._8_8_ = auVar49._8_8_ + auVar45._8_8_;
        auVar45 = vsubpd_avx(auVar90,*(undefined1 (*) [16])((long)pcVar28 + lVar42 + -0x28));
        auVar91._0_8_ = dVar2 * auVar45._0_8_;
        auVar91._8_8_ = dVar2 * auVar45._8_8_;
        auVar45 = vfmadd231pd_avx512vl(auVar91,auVar64,auVar46);
        auVar92._0_8_ = auVar34._0_8_ * auVar45._0_8_;
        auVar92._8_8_ = auVar34._8_8_ * auVar45._8_8_;
        auVar47 = vfmadd231pd_fma(auVar92,auVar55,auVar47);
        auVar45 = vpermilpd_avx(*(undefined1 (*) [16])((long)pcVar33 + lVar42 + -0x10),1);
        auVar45 = vfmadd231pd_fma(auVar45,auVar47,auVar52);
        dVar3 = *(double *)((long)pcVar28 + lVar42 + -8);
        auVar93._8_8_ = 0;
        auVar93._0_8_ = dVar3;
        auVar45 = vshufpd_avx(auVar45,auVar45,1);
        *(undefined1 (*) [16])((long)pcVar33 + lVar42 + -0x10) = auVar45;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = *(ulong *)((long)pcVar29 + lVar42 + -0x10);
        auVar45 = vsubsd_avx512f(auVar81,auVar49);
        auVar129._8_8_ = 0;
        auVar129._0_8_ = *(ulong *)((long)pcVar31 + lVar42 + -0x10);
        auVar47 = vsubsd_avx512f(auVar129,auVar81);
        auVar109._8_8_ = 0;
        auVar109._0_8_ = *(ulong *)((long)pcVar26 + lVar42 + -8);
        auVar46 = vsubsd_avx512f(auVar109,auVar93);
        auVar130._8_8_ = 0;
        auVar130._0_8_ = *(ulong *)((long)pcVar27 + lVar42 + -8);
        auVar48 = vsubsd_avx512f(auVar130,auVar109);
        auVar82._8_8_ = 0;
        auVar82._0_8_ =
             dVar5 * ((auVar49._0_8_ + auVar47._0_8_) - *(double *)((long)pcVar30 + lVar42 + -0x10))
        ;
        auVar45 = vfmadd231sd_avx512f(auVar82,auVar72,auVar45);
        auVar94._8_8_ = 0;
        auVar94._0_8_ =
             ((dVar3 + auVar48._0_8_) - *(double *)((long)pcVar32 + lVar42 + -8)) * dVar35;
        auVar49 = vfmadd231sd_avx512f(auVar94,auVar9,auVar46);
        auVar95._8_8_ = 0;
        auVar95._0_8_ = auVar49._0_8_ * -dVar4;
        auVar45 = vfmadd231sd_fma(auVar95,auVar54,auVar45);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)((long)&pcVar33->bx + lVar42);
        auVar45 = vfmadd213sd_fma(auVar45,auVar53,auVar15);
        *(long *)((long)&pcVar33->bx + lVar42) = auVar45._0_8_;
        lVar42 = lVar42 + 0x18;
      }
    }
  }
  auVar55._8_8_ = 0x8000000000000000;
  auVar55._0_8_ = 0x8000000000000000;
  for (lVar43 = 1; lVar43 < lVar40; lVar43 = lVar43 + 1) {
    lVar44 = 0x28;
    lVar41 = 1;
    dVar2 = (this->super_maxwell_solver).dtdy;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar2;
    dVar3 = (this->super_maxwell_solver).dtdz;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar3;
    dVar4 = (this->super_maxwell_solver).dtdx;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar4;
    auVar10._0_8_ = this->bx;
    auVar10._8_8_ = this->by;
    auVar11._0_8_ = this->ax;
    auVar11._8_8_ = this->ay;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = this->by;
    dVar5 = this->ay;
    pfVar23 = (this->super_maxwell_solver).ce;
    auVar61._0_8_ = -dVar2;
    auVar61._8_8_ = 0x8000000000000000;
    auVar68._0_8_ = -dVar3;
    auVar68._8_8_ = 0x8000000000000000;
    auVar59._0_8_ = -dVar4;
    auVar59._8_8_ = 0x8000000000000000;
    auVar34 = vunpcklpd_avx(auVar73,auVar61);
    auVar45 = vunpcklpd_avx(auVar68,auVar65);
    auVar69._8_8_ = this->bz;
    auVar69._0_8_ = this->bz;
    dVar2 = this->az;
    while (lVar41 < lVar1) {
      pppcVar24 = (pfVar23->p)._M_t.
                  super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                  super__Head_base<0UL,_celle_***,_false>._M_head_impl;
      lVar41 = lVar41 + 1;
      ppcVar25 = pppcVar24[lVar37 + -1];
      pcVar26 = ppcVar25[lVar43];
      pcVar27 = ppcVar25[lVar43 + 1];
      pcVar28 = ppcVar25[lVar43 + -1];
      pcVar29 = ppcVar25[lVar43 + 2];
      pcVar30 = pppcVar24[lVar37 + -2][lVar43];
      pcVar33 = (pfVar22->p)._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>.
                _M_t.super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar37 + -1][lVar43];
      auVar96._8_8_ = 0;
      auVar96._0_8_ = *(ulong *)((long)&pcVar27->ex + lVar44);
      dVar3 = *(double *)((long)&pcVar26->ex + lVar44);
      auVar110._8_8_ = 0;
      auVar110._0_8_ = dVar3;
      auVar49 = vsubsd_avx512f(auVar96,auVar110);
      auVar131._8_8_ = 0;
      auVar131._0_8_ = *(ulong *)((long)&pcVar29->ex + lVar44);
      auVar47 = vsubsd_avx512f(auVar131,auVar96);
      auVar46 = vxorpd_avx512vl(auVar110,auVar55);
      auVar46 = vunpcklpd_avx512vl(auVar46,auVar49);
      auVar97._8_8_ = 0;
      auVar97._0_8_ = dVar3 + auVar47._0_8_;
      auVar47 = vunpcklpd_avx(auVar110,auVar97);
      auVar111._8_8_ = 0;
      auVar111._0_8_ = *(ulong *)((long)&pcVar30->ex + lVar44);
      auVar49 = vmovhpd_avx(auVar111,*(undefined8 *)((long)&pcVar28->ex + lVar44));
      auVar47 = vsubpd_avx(auVar47,auVar49);
      auVar49 = *(undefined1 (*) [16])((long)&pcVar26->ey + lVar44);
      auVar98._0_8_ = auVar47._0_8_ * (double)auVar11._0_8_;
      auVar98._8_8_ = auVar47._8_8_ * (double)auVar11._8_8_;
      auVar46 = vfmadd231pd_avx512vl(auVar98,auVar10,auVar46);
      auVar47 = *(undefined1 (*) [16])((long)pcVar26 + lVar44 + -0x10);
      auVar48 = vsubpd_avx512vl(auVar49,auVar47);
      auVar49 = vsubpd_avx512vl(*(undefined1 (*) [16])((long)&pcVar26[1].ey + lVar44),auVar49);
      auVar49 = vaddpd_avx512vl(auVar47,auVar49);
      auVar49 = vsubpd_avx(auVar49,*(undefined1 (*) [16])((long)pcVar26 + lVar44 + -0x28));
      auVar112._0_8_ = dVar2 * auVar49._0_8_;
      auVar112._8_8_ = dVar2 * auVar49._8_8_;
      auVar49 = vfmadd231pd_avx512vl(auVar112,auVar69,auVar48);
      auVar113._0_8_ = auVar45._0_8_ * auVar49._0_8_;
      auVar113._8_8_ = auVar45._8_8_ * auVar49._8_8_;
      auVar46 = vfmadd231pd_fma(auVar113,auVar34,auVar46);
      auVar49 = vpermilpd_avx(*(undefined1 (*) [16])((long)pcVar33 + lVar44 + -0x10),1);
      auVar49 = vfmadd231pd_fma(auVar49,auVar46,auVar52);
      auVar114._8_8_ = 0;
      auVar114._0_8_ = *(ulong *)((long)pcVar26 + lVar44 + -8);
      auVar49 = vshufpd_avx(auVar49,auVar49,1);
      *(undefined1 (*) [16])((long)pcVar33 + lVar44 + -0x10) = auVar49;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = *(ulong *)((long)pcVar27 + lVar44 + -0x10);
      auVar49 = vsubsd_avx512f(auVar99,auVar47);
      auVar135._8_8_ = 0;
      auVar135._0_8_ = *(ulong *)((long)pcVar29 + lVar44 + -0x10);
      auVar46 = vsubsd_avx512f(auVar135,auVar99);
      auVar47 = vaddsd_avx512f(auVar47,auVar46);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)((long)pcVar30 + lVar44 + -8);
      auVar46 = vsubsd_avx512f(auVar114,auVar16);
      auVar46 = vmulsd_avx512f(auVar11,auVar46);
      auVar46 = vfnmadd231sd_avx512f(auVar46,auVar10,auVar114);
      auVar100._8_8_ = 0;
      auVar100._0_8_ = dVar5 * (auVar47._0_8_ - *(double *)((long)pcVar28 + lVar44 + -0x10));
      auVar49 = vfmadd231sd_avx512f(auVar100,auVar76,auVar49);
      auVar47 = vmulsd_avx512f(auVar46,auVar59);
      auVar49 = vfmadd231sd_fma(auVar47,auVar56,auVar49);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)((long)&pcVar33->bx + lVar44);
      auVar49 = vfmadd213sd_fma(auVar49,auVar53,auVar17);
      *(long *)((long)&pcVar33->bx + lVar44) = auVar49._0_8_;
      lVar44 = lVar44 + 0x18;
    }
  }
  for (lVar37 = 1; lVar37 < lVar38; lVar37 = lVar37 + 1) {
    lVar44 = 0x28;
    lVar43 = 1;
    dVar2 = (this->super_maxwell_solver).dtdy;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar2;
    dVar3 = (this->super_maxwell_solver).dtdz;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar3;
    dVar4 = (this->super_maxwell_solver).dtdx;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = dVar4;
    auVar12._0_8_ = this->bx;
    auVar12._8_8_ = this->by;
    dVar35 = this->ax;
    dVar36 = this->ay;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = this->by;
    dVar5 = this->ay;
    pfVar23 = (this->super_maxwell_solver).ce;
    auVar62._0_8_ = -dVar2;
    auVar62._8_8_ = 0x8000000000000000;
    auVar70._0_8_ = -dVar3;
    auVar70._8_8_ = 0x8000000000000000;
    auVar55 = vunpcklpd_avx(auVar74,auVar62);
    auVar34 = vunpcklpd_avx(auVar70,auVar66);
    auVar71._8_8_ = this->bz;
    auVar71._0_8_ = this->bz;
    dVar2 = this->az;
    while (lVar43 < lVar1) {
      pppcVar24 = (pfVar23->p)._M_t.
                  super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                  super__Head_base<0UL,_celle_***,_false>._M_head_impl;
      lVar43 = lVar43 + 1;
      pcVar26 = pppcVar24[lVar37][lVar39 + -1];
      pcVar27 = pppcVar24[lVar37][lVar39 + -2];
      pcVar28 = pppcVar24[lVar37 + -1][lVar39 + -1];
      pcVar33 = (pfVar22->p)._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>.
                _M_t.super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar37][lVar39 + -1];
      uVar7 = *(ulong *)((long)&pcVar26->ex + lVar44);
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uVar7;
      pcVar29 = pppcVar24[lVar37 + 1][lVar39 + -1];
      pcVar30 = pppcVar24[lVar37 + 2][lVar39 + -1];
      auVar115._0_8_ = uVar7 ^ 0x8000000000000000;
      auVar115._8_8_ = 0x8000000000000000;
      auVar125._8_8_ = 0;
      auVar125._0_8_ = *(ulong *)((long)&pcVar29->ex + lVar44);
      auVar45 = vsubsd_avx512f(auVar125,auVar101);
      auVar49 = vunpcklpd_avx512vl(auVar45,auVar115);
      auVar132._8_8_ = 0;
      auVar132._0_8_ = *(ulong *)((long)&pcVar30->ex + lVar44);
      auVar45 = vsubsd_avx512f(auVar132,auVar125);
      auVar45 = vaddsd_avx512f(auVar101,auVar45);
      auVar45 = vunpcklpd_avx512vl(auVar45,auVar101);
      uVar6 = *(undefined8 *)((long)&pcVar27->ex + lVar44);
      auVar126._8_8_ = uVar6;
      auVar126._0_8_ = uVar6;
      auVar47 = vsubpd_avx512vl(auVar45,auVar126);
      auVar45 = *(undefined1 (*) [16])((long)pcVar26 + lVar44 + -0x10);
      auVar102._0_8_ = auVar47._0_8_ * dVar35;
      auVar102._8_8_ = auVar47._8_8_ * dVar36;
      auVar47 = vfmadd231pd_fma(auVar102,auVar12,auVar49);
      auVar49 = *(undefined1 (*) [16])((long)&pcVar26->ey + lVar44);
      auVar46 = vsubpd_avx512vl(auVar49,auVar45);
      auVar49 = vsubpd_avx512vl(*(undefined1 (*) [16])((long)&pcVar26[1].ey + lVar44),auVar49);
      auVar49 = vaddpd_avx512vl(auVar45,auVar49);
      auVar49 = vsubpd_avx(auVar49,*(undefined1 (*) [16])((long)pcVar26 + lVar44 + -0x28));
      auVar116._0_8_ = dVar2 * auVar49._0_8_;
      auVar116._8_8_ = dVar2 * auVar49._8_8_;
      auVar49 = vfmadd231pd_avx512vl(auVar116,auVar71,auVar46);
      auVar117._0_8_ = auVar34._0_8_ * auVar49._0_8_;
      auVar117._8_8_ = auVar34._8_8_ * auVar49._8_8_;
      auVar47 = vfmadd231pd_fma(auVar117,auVar55,auVar47);
      auVar49 = vpermilpd_avx(*(undefined1 (*) [16])((long)pcVar33 + lVar44 + -0x10),1);
      auVar49 = vfmadd231pd_fma(auVar49,auVar47,auVar52);
      auVar118._8_8_ = 0;
      auVar118._0_8_ = *(ulong *)((long)pcVar26 + lVar44 + -8);
      auVar49 = vshufpd_avx(auVar49,auVar49,1);
      *(undefined1 (*) [16])((long)pcVar33 + lVar44 + -0x10) = auVar49;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)((long)pcVar27 + lVar44 + -0x10);
      auVar49 = vsubsd_avx512f(auVar45,auVar18);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = dVar5 * auVar49._0_8_;
      auVar45 = vfnmadd231sd_avx512f(auVar103,auVar77,auVar45);
      auVar127._8_8_ = 0;
      auVar127._0_8_ = *(ulong *)((long)pcVar29 + lVar44 + -8);
      auVar49 = vsubsd_avx512f(auVar127,auVar118);
      auVar136._8_8_ = 0;
      auVar136._0_8_ = *(ulong *)((long)pcVar30 + lVar44 + -8);
      auVar47 = vsubsd_avx512f(auVar136,auVar127);
      auVar47 = vaddsd_avx512f(auVar118,auVar47);
      auVar119._8_8_ = 0;
      auVar119._0_8_ = (auVar47._0_8_ - *(double *)((long)pcVar28 + lVar44 + -8)) * dVar35;
      auVar49 = vfmadd231sd_avx512f(auVar119,auVar12,auVar49);
      auVar120._8_8_ = 0;
      auVar120._0_8_ = auVar49._0_8_ * -dVar4;
      auVar45 = vfmadd231sd_fma(auVar120,auVar57,auVar45);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)((long)&pcVar33->bx + lVar44);
      auVar45 = vfmadd213sd_fma(auVar45,auVar53,auVar19);
      *(long *)((long)&pcVar33->bx + lVar44) = auVar45._0_8_;
      lVar44 = lVar44 + 0x18;
    }
  }
  lVar37 = (long)iVar21 + -1;
  for (lVar39 = 1; lVar39 < lVar38; lVar39 = lVar39 + 1) {
    lVar43 = 1;
    dVar2 = (this->super_maxwell_solver).dtdy;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar2;
    dVar3 = (this->super_maxwell_solver).dtdz;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar3;
    dVar4 = (this->super_maxwell_solver).dtdx;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar4;
    auVar34._0_8_ = this->bx;
    auVar34._8_8_ = this->by;
    dVar35 = this->ax;
    dVar36 = this->ay;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = this->by;
    dVar5 = this->ay;
    pfVar23 = (this->super_maxwell_solver).ce;
    auVar45._0_8_ = -dVar2;
    auVar45._8_8_ = 0x8000000000000000;
    auVar46._0_8_ = -dVar3;
    auVar46._8_8_ = 0x8000000000000000;
    auVar55 = vunpcklpd_avx(auVar50,auVar45);
    auVar45 = vunpcklpd_avx(auVar46,auVar47);
    auVar48._8_8_ = this->bz;
    auVar48._0_8_ = this->bz;
    dVar2 = this->az;
    while (lVar43 < lVar40) {
      pppcVar24 = (pfVar23->p)._M_t.
                  super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                  super__Head_base<0UL,_celle_***,_false>._M_head_impl;
      ppcVar25 = pppcVar24[lVar39];
      pcVar26 = ppcVar25[lVar43];
      pcVar27 = ppcVar25[lVar43 + 1];
      pcVar28 = ppcVar25[lVar43 + -1];
      pcVar29 = ppcVar25[lVar43 + 2];
      pcVar33 = (pfVar22->p)._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>.
                _M_t.super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar39][lVar43];
      pcVar30 = pppcVar24[lVar39 + 1][lVar43];
      pcVar31 = pppcVar24[lVar39 + 2][lVar43];
      dVar3 = pcVar26[lVar37].ez;
      auVar104._8_8_ = dVar3;
      auVar104._0_8_ = dVar3;
      pcVar32 = pppcVar24[lVar39 + -1][lVar43];
      lVar43 = lVar43 + 1;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = pcVar30[lVar37].ez;
      auVar47 = vmovhpd_avx(auVar83,pcVar27[lVar37].ez);
      dVar8 = pcVar29[lVar37].ez;
      auVar128._8_8_ = dVar8;
      auVar128._0_8_ = dVar8;
      auVar46 = vsubpd_avx(auVar47,auVar104);
      auVar47 = vsubpd_avx512vl(auVar128,auVar47);
      auVar84._0_8_ = dVar3 + auVar47._0_8_;
      auVar84._8_8_ = dVar3 + auVar47._8_8_;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = pcVar32[lVar37].ez;
      auVar47 = vmovhpd_avx(auVar105,pcVar28[lVar37].ez);
      auVar47 = vsubpd_avx(auVar84,auVar47);
      auVar13._0_8_ = pcVar26[lVar37].ex;
      auVar13._8_8_ = pcVar26[lVar37].ey;
      auVar85._0_8_ = auVar47._0_8_ * dVar35;
      auVar85._8_8_ = auVar47._8_8_ * dVar36;
      auVar46 = vfmadd231pd_fma(auVar85,auVar34,auVar46);
      auVar51._0_8_ = pcVar26[lVar1].ex;
      auVar51._8_8_ = pcVar26[lVar1].ey;
      auVar47 = vsubpd_avx(auVar13,auVar51);
      auVar121._0_8_ = dVar2 * auVar47._0_8_;
      auVar121._8_8_ = dVar2 * auVar47._8_8_;
      auVar47 = vfnmadd231pd_fma(auVar121,auVar48,auVar13);
      auVar122._0_8_ = auVar45._0_8_ * auVar47._0_8_;
      auVar122._8_8_ = auVar45._8_8_ * auVar47._8_8_;
      auVar46 = vfmadd231pd_fma(auVar122,auVar55,auVar46);
      auVar14._0_8_ = pcVar33[lVar37].bx;
      auVar14._8_8_ = pcVar33[lVar37].by;
      auVar47 = vpermilpd_avx(auVar14,1);
      auVar47 = vfmadd231pd_fma(auVar47,auVar46,auVar52);
      dVar3 = pcVar26[lVar37].ey;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = dVar3;
      auVar47 = vshufpd_avx(auVar47,auVar47,1);
      pcVar33[lVar37].bx = (double)auVar47._0_8_;
      pcVar33[lVar37].by = (double)auVar47._8_8_;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = pcVar27[lVar37].ex;
      auVar47 = vsubsd_avx512f(auVar86,auVar13);
      auVar133._8_8_ = 0;
      auVar133._0_8_ = pcVar29[lVar37].ex;
      auVar46 = vsubsd_avx512f(auVar133,auVar86);
      auVar106._8_8_ = 0;
      auVar106._0_8_ = pcVar30[lVar37].ey;
      auVar50 = vsubsd_avx512f(auVar106,auVar123);
      auVar134._8_8_ = 0;
      auVar134._0_8_ = pcVar31[lVar37].ey;
      auVar51 = vsubsd_avx512f(auVar134,auVar106);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = dVar5 * (((double)auVar13._0_8_ + auVar46._0_8_) - pcVar28[lVar37].ex);
      auVar47 = vfmadd231sd_avx512f(auVar87,auVar75,auVar47);
      auVar107._8_8_ = 0;
      auVar107._0_8_ = ((dVar3 + auVar51._0_8_) - pcVar32[lVar37].ey) * dVar35;
      auVar46 = vfmadd231sd_avx512f(auVar107,auVar34,auVar50);
      auVar108._8_8_ = 0;
      auVar108._0_8_ = auVar46._0_8_ * -dVar4;
      auVar47 = vfmadd231sd_fma(auVar108,auVar49,auVar47);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = pcVar33[lVar37].bz;
      auVar47 = vfmadd213sd_fma(auVar47,auVar53,auVar20);
      pcVar33[lVar37].bz = auVar47._0_8_;
    }
  }
  return;
}

Assistant:

void five_point_solver::advance_b()
{
    const int nx = cb.get_nx();
    const int ny = cb.get_ny();
    const int nz = cb.get_nz();
    // 1/2 b advance
    for(int i=1;i<nx-2;i++) {
        for(int j=1;j<ny-2;j++) {
            for(int k=1;k<nz-2;k++) {
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(ce[i][j+1][k].ez-ce[i][j][k].ez) + ay*(ce[i][j+2][k].ez-ce[i][j+1][k].ez+ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(ce[i][j][k+1].ey-ce[i][j][k].ey) + az*(ce[i][j][k+2].ey-ce[i][j][k+1].ey+ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(ce[i+1][j][k].ez-ce[i][j][k].ez) + ax*(ce[i+2][j][k].ez-ce[i+1][j][k].ez+ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(ce[i][j][k+1].ex-ce[i][j][k].ex) + az*(ce[i][j][k+2].ex-ce[i][j][k+1].ex+ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(ce[i][j+1][k].ex-ce[i][j][k].ex) + ay*(ce[i][j+2][k].ex-ce[i][j+1][k].ex+ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(ce[i+1][j][k].ey-ce[i][j][k].ey) + ax*(ce[i+2][j][k].ey-ce[i+1][j][k].ey+ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
    {int i=nx-1;
        for(int j=1;j<ny-2;j++) {
            for(int k=1;k<nz-2;k++) {
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(ce[i][j+1][k].ez-ce[i][j][k].ez) + ay*(ce[i][j+2][k].ez-ce[i][j+1][k].ez+ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(ce[i][j][k+1].ey-ce[i][j][k].ey) + az*(ce[i][j][k+2].ey-ce[i][j][k+1].ey+ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(-ce[i][j][k].ez) + ax*(ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(ce[i][j][k+1].ex-ce[i][j][k].ex) + az*(ce[i][j][k+2].ex-ce[i][j][k+1].ex+ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(ce[i][j+1][k].ex-ce[i][j][k].ex) + ay*(ce[i][j+2][k].ex-ce[i][j+1][k].ex+ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(-ce[i][j][k].ey) + ax*(ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
    for(int i=1;i<nx-2;i++) {
        {int j=ny-1;
            for(int k=1;k<nz-2;k++) {
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(-ce[i][j][k].ez) + ay*(ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(ce[i][j][k+1].ey-ce[i][j][k].ey) + az*(ce[i][j][k+2].ey-ce[i][j][k+1].ey+ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(ce[i+1][j][k].ez-ce[i][j][k].ez) + ax*(ce[i+2][j][k].ez-ce[i+1][j][k].ez+ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(ce[i][j][k+1].ex-ce[i][j][k].ex) + az*(ce[i][j][k+2].ex-ce[i][j][k+1].ex+ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(-ce[i][j][k].ex) + ay*(ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(ce[i+1][j][k].ey-ce[i][j][k].ey) + ax*(ce[i+2][j][k].ey-ce[i+1][j][k].ey+ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
    for(int i=1;i<nx-2;i++) {
        for(int j=1;j<ny-2;j++) {
            {int k=nz-1;
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(ce[i][j+1][k].ez-ce[i][j][k].ez) + ay*(ce[i][j+2][k].ez-ce[i][j+1][k].ez+ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(-ce[i][j][k].ey) + az*(ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(ce[i+1][j][k].ez-ce[i][j][k].ez) + ax*(ce[i+2][j][k].ez-ce[i+1][j][k].ez+ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(-ce[i][j][k].ex) + az*(ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(ce[i][j+1][k].ex-ce[i][j][k].ex) + ay*(ce[i][j+2][k].ex-ce[i][j+1][k].ex+ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(ce[i+1][j][k].ey-ce[i][j][k].ey) + ax*(ce[i+2][j][k].ey-ce[i+1][j][k].ey+ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
}